

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# batched_data_collection.cpp
# Opt level: O1

void __thiscall
duckdb::BatchCollectionChunkScanState::InternalLoad
          (BatchCollectionChunkScanState *this,ErrorData *error)

{
  unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true> *this_00;
  BatchedDataCollection *this_01;
  pointer pDVar1;
  type output;
  
  if ((this->state).range.begin._M_node != (this->state).range.end._M_node) {
    (this->super_ChunkScanState).offset = 0;
    this_00 = &(this->super_ChunkScanState).current_chunk;
    pDVar1 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator->
                       (this_00);
    DataChunk::Reset(pDVar1);
    this_01 = this->collection;
    output = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator*
                       (this_00);
    BatchedDataCollection::Scan(this_01,&this->state,output);
    return;
  }
  pDVar1 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator->
                     (&(this->super_ChunkScanState).current_chunk);
  pDVar1->count = 0;
  return;
}

Assistant:

void BatchCollectionChunkScanState::InternalLoad(ErrorData &error) {
	if (state.range.begin == state.range.end) {
		// Signal empty chunk to break out of the loop
		current_chunk->SetCardinality(0);
		return;
	}
	offset = 0;
	current_chunk->Reset();
	collection.Scan(state, *current_chunk);
	return;
}